

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O1

cupdlp_float diffTwoNormSquared(cupdlp_float *x,cupdlp_float *y,cupdlp_int len)

{
  ulong uVar1;
  double dVar2;
  
  if (0 < len) {
    dVar2 = 0.0;
    uVar1 = 0;
    do {
      dVar2 = dVar2 + (x[uVar1] - y[uVar1]) * (x[uVar1] - y[uVar1]);
      uVar1 = uVar1 + 1;
    } while ((uint)len != uVar1);
    return dVar2;
  }
  return 0.0;
}

Assistant:

cupdlp_float diffTwoNormSquared(cupdlp_float *x, cupdlp_float *y,
                                const cupdlp_int len) {
  cupdlp_float res = 0.0;
  for (int i = 0; i < len; i++) {
    cupdlp_float tmp = x[i] - y[i];
    res += tmp * tmp;
  }
  return res;
}